

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

bool __thiscall Board::solved(Board *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  while (lVar1 != 9) {
    for (lVar2 = 0x30; lVar2 != 0x33; lVar2 = lVar2 + 1) {
      if ((char)((char)lVar1 + (char)lVar2) != *(char *)((long)(this->board + -0x10) + lVar2))
      goto LAB_00108c9b;
    }
    this = (Board *)(this->board + 1);
    lVar1 = lVar1 + 3;
  }
LAB_00108c9b:
  return lVar1 == 9;
}

Assistant:

bool Board::solved() const {
    char cur = '0';

    for (const Board::Row& row : board) {
        for (char tile : row) {
            if (tile != cur++) {
                return false;
            }
        }
    }

    return true;
}